

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O0

string * __thiscall wallet::CWallet::GetDisplayName_abi_cxx11_(CWallet *this)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string wallet_name;
  CWallet *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  allocator<char> local_29 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  this_01 = in_RDI;
  GetName_abi_cxx11_(in_stack_ffffffffffffff78);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff78);
  bVar2 = 0;
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)this_00,(allocator<char> *)CONCAT17(1,in_stack_ffffffffffffffb8));
  }
  else {
    GetName_abi_cxx11_(in_stack_ffffffffffffff78);
    std::__cxx11::string::string
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar2,in_stack_ffffffffffffffb8));
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator(local_29);
  }
  tinyformat::format<std::__cxx11::string>(in_stack_ffffffffffffffa8,in_RSI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string GetDisplayName() const override
    {
        std::string wallet_name = GetName().length() == 0 ? "default wallet" : GetName();
        return strprintf("[%s]", wallet_name);
    }